

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

int xmlSchematronUnregisterVariables(xmlXPathContextPtr ctxt,xmlSchematronLetPtr_conflict let)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlSchematronLetPtr_conflict local_20;
  xmlSchematronLetPtr_conflict let_local;
  xmlXPathContextPtr ctxt_local;
  
  local_20 = let;
  while( true ) {
    if (local_20 == (xmlSchematronLetPtr_conflict)0x0) {
      return 0;
    }
    iVar2 = xmlXPathRegisterVariableNS(ctxt,local_20->name,(xmlChar *)0x0,(xmlXPathObjectPtr)0x0);
    if (iVar2 != 0) break;
    local_20 = local_20->next;
  }
  pp_Var3 = __xmlGenericError();
  p_Var1 = *pp_Var3;
  ppvVar4 = __xmlGenericErrorContext();
  (*p_Var1)(*ppvVar4,"Unregistering a let variable failed\n");
  return -1;
}

Assistant:

static int
xmlSchematronUnregisterVariables(xmlXPathContextPtr ctxt, xmlSchematronLetPtr let)
{
    while (let != NULL) {
        if (xmlXPathRegisterVariableNS(ctxt, let->name, NULL, NULL)) {
            xmlGenericError(xmlGenericErrorContext,
                            "Unregistering a let variable failed\n");
            return -1;
        }
        let = let->next;
    }
    return 0;
}